

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
App::renderTextures_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,App *this,Glyphs *glyphs,Config *config,Font *font,
          vector<Config::Size,_std::allocator<Config::Size>_> *pages)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  char cVar8;
  _Rb_tree_node_base *p_Var9;
  uint32_t *puVar10;
  long lVar11;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  uint uVar14;
  long lVar15;
  FT_Face_conflict pFVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  App *local_250;
  Font *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> surface;
  __string_type fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  Config *local_1c0;
  stringstream ss;
  long local_1a8 [2];
  long alStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar13 = __return_storage_ptr__;
  local_250 = this;
  local_248 = font;
  local_1c0 = config;
  if ((FT_Face_conflict)font->library != font->face) {
    lVar15 = 0;
    uVar14 = (int)((ulong)((long)font->face - (long)font->library) >> 3) - 1;
    do {
      lVar15 = lVar15 + 0x100000000;
      bVar7 = 9 < uVar14;
      uVar14 = uVar14 / 10;
    } while (bVar7);
    pFVar16 = (FT_Face_conflict)font->library;
    local_1c8 = __return_storage_ptr__;
    if (font->face != pFVar16) {
      uVar12 = 0;
      do {
        _ss = (uint)*(uint3 *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&surface,(ulong)(uint)(*(int *)((long)&pFVar16->num_faces + uVar12 * 8 + 4) *
                                         *(int *)(&pFVar16->num_faces + uVar12)),
                   (value_type_conflict *)&ss,(allocator_type *)&fileName);
        for (p_Var9 = *(_Rb_tree_node_base **)(local_250 + 0x18);
            p_Var9 != (_Rb_tree_node_base *)(this + 8);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          if (((*(int *)&p_Var9[1].field_0x4 == (int)uVar12) && (*(int *)&p_Var9[1]._M_left != 0))
             && (*(int *)((long)&p_Var9[1]._M_left + 4) != 0)) {
            ft::Font::renderGlyph
                      ((GlyphMetrics *)&ss,(Font *)local_1c0,
                       surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       *(uint32_t *)(&pFVar16->num_faces + uVar12),
                       *(uint32_t *)((long)&pFVar16->num_faces + uVar12 * 8 + 4),
                       glyphs[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                       *(int *)&p_Var9[1]._M_parent,
                       *(int *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               4) + *(int *)((long)&p_Var9[1]._M_parent + 4),p_Var9[1]._M_color,
                       (uint)*(uint3 *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_right);
          }
        }
        if ((*(char *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 6)
             == '\0') &&
           (surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start <=
            surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish + -1)) {
          bVar1 = *(byte *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          bVar2 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                           1);
          bVar3 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                           2);
          bVar4 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                           3);
          bVar5 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                           4);
          bVar6 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                           5);
          puVar10 = surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar14 = *puVar10 >> 0x18;
            *puVar10 = ((uint)bVar2 * 0x100 * uVar14 | (uint)bVar5 * 0x100 * (0x100 - uVar14)) >> 8
                       & 0xff00 |
                       (uVar14 * ((uint)bVar3 << 0x10 | (uint)bVar1) |
                       (0x100 - uVar14) * ((uint)bVar6 << 0x10 | (uint)bVar4)) >> 8 & 0xff00ff;
            puVar10 = puVar10 + 1;
          } while (puVar10 <=
                   surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   *(char **)&glyphs[3]._M_t._M_impl.super__Rb_tree_header._M_header,
                   (long)glyphs[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 != 2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
          if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 == 0) {
            lVar11 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar11 + 1] == '\0') {
              cVar8 = std::ios::widen((char)local_1a8 + (char)lVar11);
              acStack_c8[lVar11] = cVar8;
              acStack_c8[lVar11 + 1] = '\x01';
            }
            acStack_c8[lVar11] = '0';
            *(long *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = lVar15 >> 0x20;
          }
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".png",4);
        std::__cxx11::stringbuf::str();
        local_270 = &local_260;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,fileName._M_dataplus._M_p,
                   fileName._M_dataplus._M_p + fileName._M_string_length);
        lVar11 = std::__cxx11::string::find_last_of((char *)&local_270,0x1761a8,0xffffffffffffffff);
        if (lVar11 != -1) {
          std::__cxx11::string::erase((ulong)&local_270,0);
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        if (local_270 == &local_260) {
          local_240.field_2._8_8_ = local_260._8_8_;
        }
        else {
          local_240._M_dataplus._M_p = (pointer)local_270;
        }
        local_240.field_2._M_allocated_capacity._1_7_ = local_260._M_allocated_capacity._1_7_;
        local_240.field_2._M_local_buf[0] = local_260._M_local_buf[0];
        local_240._M_string_length = local_268;
        local_268 = 0;
        local_260._M_local_buf[0] = '\0';
        local_270 = &local_260;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   &local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270);
        }
        savePng(&fileName,
                surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,*(uint32_t *)(&pFVar16->num_faces + uVar12),
                *(uint32_t *)((long)&pFVar16->num_faces + uVar12 * 8 + 4),
                *(bool *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 6
                         ));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileName._M_dataplus._M_p != &fileName.field_2) {
          operator_delete(fileName._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        if (surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pFVar16 = (FT_Face_conflict)local_248->library;
      } while (uVar12 < (ulong)((long)local_248->face - (long)pFVar16 >> 3));
    }
    __return_storage_ptr__ = &local_1e8;
    (local_1c8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_1c8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_1c8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar13 = local_1c8;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return pvVar13;
}

Assistant:

std::vector<std::string> App::renderTextures(const Glyphs& glyphs, const Config& config, const ft::Font& font, const std::vector<Config::Size>& pages)
{
    std::vector<std::string> fileNames;
    if (pages.empty())
        return {};

    const auto pageNameDigits = getNumberLen(pages.size() - 1);

    for (std::uint32_t page = 0; page < pages.size(); ++page)
    {
        const Config::Size& s = pages[page];
        std::vector<std::uint32_t> surface(s.w * s.h, config.color.getBGR());

        // Render every glyph
        //TODO: do not repeat same glyphs (with same index)
        for (const auto& kv: glyphs)
        {
            const auto& glyph = kv.second;
            if (glyph.page != page)
                continue;

            if (!glyph.isEmpty())
            {
                const auto x = glyph.x + config.padding.left;
                const auto y = glyph.y + config.padding.up;

                font.renderGlyph(&surface[0], s.w, s.h, x, y,
                        kv.first, config.color.getBGR());
            }
        }

        if (!config.backgroundTransparent)
        {
            auto cur = surface.data();
            const auto end = &surface.back();

            const auto fgColor = config.color.getBGR();
            const auto bgColor = config.backgroundColor.getBGR();

            while (cur <= end)
            {
                const std::uint32_t a0 = (*cur) >> 24u;
                const std::uint32_t a1 = 256 - a0;
                const std::uint32_t rb1 = (a1 * (bgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t rb2 = (a0 * (fgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t g1  = (a1 * (bgColor & 0x00FF00u)) >> 8u;
                const std::uint32_t g2  = (a0 * (fgColor & 0x00FF00u)) >> 8u;
                *cur =  ((rb1 | rb2) & 0xFF00FFu) + ((g1 | g2) & 0x00FF00u);
                ++cur;
            }
        }

        std::stringstream ss;
        ss << config.output;
        if (config.textureNameSuffix != Config::TextureNameSuffix::None)
        {
            ss << "_";
            if (config.textureNameSuffix == Config::TextureNameSuffix::IndexAligned)
                ss << std::setfill ('0') << std::setw(pageNameDigits);
            ss << page;
        }
        ss << ".png";
        const auto fileName = ss.str();
        fileNames.push_back(extractFileName(fileName));

        savePng(fileName, &surface[0], s.w, s.h, config.backgroundTransparent);
    }

    return fileNames;
}